

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarCommon.cpp
# Opt level: O1

int ZXing::OneD::DataBar::combins(int n,int r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = n - r;
  iVar1 = r;
  if (r < iVar3) {
    iVar1 = iVar3;
  }
  if (r <= iVar3) {
    iVar3 = r;
  }
  iVar2 = 1;
  iVar4 = 1;
  if (iVar1 < n) {
    do {
      iVar2 = iVar2 * n;
      if (iVar4 <= iVar3) {
        iVar2 = iVar2 / iVar4;
        iVar4 = iVar4 + 1;
      }
      n = n + -1;
    } while (iVar1 < n);
  }
  if (iVar4 <= iVar3) {
    do {
      iVar2 = iVar2 / iVar4;
      iVar4 = iVar4 + 1;
    } while (iVar3 + 1 != iVar4);
  }
  return iVar2;
}

Assistant:

static int combins(int n, int r)
{
	int maxDenom;
	int minDenom;
	if (n - r > r) {
		minDenom = r;
		maxDenom = n - r;
	} else {
		minDenom = n - r;
		maxDenom = r;
	}
	int val = 1;
	int j   = 1;
	for (int i = n; i > maxDenom; i--) {
		val *= i;
		if (j <= minDenom) {
			val /= j;
			j++;
		}
	}
	while (j <= minDenom) {
		val /= j;
		j++;
	}
	return val;
}